

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

vm_obj_id_t CVmObjString::create(int in_root_set,char *src,size_t srclen,CCharmapToUni *cmap)

{
  vm_obj_id_t vVar1;
  CVmObject *this;
  size_t in_RCX;
  CVmObjString *retstr;
  vm_obj_id_t ret;
  size_t ulen;
  char *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  CCharmapToUni::map_str
            ((CCharmapToUni *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0x391ac2)
  ;
  vVar1 = create((int)(in_stack_ffffffffffffffc0 >> 0x20),(size_t)in_stack_ffffffffffffffb8);
  this = vm_objp(0);
  cons_get_buf((CVmObjString *)this);
  CCharmapToUni::map_str
            ((CCharmapToUni *)CONCAT44(vVar1,in_stack_ffffffffffffffd0),(char *)this,in_RCX,
             in_stack_ffffffffffffffb8,0x391b17);
  return vVar1;
}

Assistant:

vm_obj_id_t CVmObjString::create(VMG_ int in_root_set,
                                 const char *src, size_t srclen,
                                 CCharmapToUni *cmap)
{
    /* figure the size needed for the conversion */
    size_t ulen = cmap->map_str(0, 0, src, srclen);

    /* create a string of the mapped length */
    vm_obj_id_t ret = create(vmg_ in_root_set, ulen);
    CVmObjString *retstr = (CVmObjString *)vm_objp(vmg_ ret);

    /* map into the string buffer */
    cmap->map_str(retstr->cons_get_buf(), ulen, src, srclen);

    /* return the new string */
    return ret;
}